

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

void __thiscall
duckdb::BatchInsertGlobalState::AddCollection
          (BatchInsertGlobalState *this,ClientContext *context,idx_t batch_index,
          idx_t min_batch_index,PhysicalIndex collection_index,
          optional_ptr<duckdb::OptimisticDataWriter,_true> writer)

{
  atomic<unsigned_long> *paVar1;
  RowGroupBatchEntry *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  RowGroupCollection *this_00;
  idx_t iVar4;
  OptimisticDataWriter *this_01;
  long lVar5;
  ulong uVar6;
  InternalException *pIVar7;
  ulong uVar8;
  ulong uVar9;
  const_iterator __position;
  idx_t iVar10;
  bool bVar11;
  allocator local_a9;
  idx_t local_a8;
  idx_t local_a0;
  pthread_mutex_t *local_98;
  optional_ptr<duckdb::OptimisticDataWriter,_true> writer_local;
  RowGroupBatchEntry new_entry;
  string local_50;
  
  local_a8 = batch_index;
  local_a0 = min_batch_index;
  writer_local = writer;
  if (batch_index < min_batch_index) {
    pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&new_entry,
               "Batch index of the added collection (%llu) is smaller than the min batch index (%llu)"
               ,(allocator *)&local_50);
    InternalException::InternalException<unsigned_long,unsigned_long>
              (pIVar7,(string *)&new_entry,local_a8,local_a0);
    __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar3 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  this_00 = DataTable::GetOptimisticCollection
                      ((DataTable *)CONCAT44(extraout_var,iVar3),context,collection_index);
  iVar4 = RowGroupCollection::GetTotalRows(this_00);
  uVar8 = this->row_group_size;
  bVar11 = iVar4 < uVar8;
  if (writer.ptr != (OptimisticDataWriter *)0x0 && !bVar11) {
    this_01 = optional_ptr<duckdb::OptimisticDataWriter,_true>::operator->(&writer_local);
    OptimisticDataWriter::WriteLastRowGroup(this_01,this_00);
  }
  local_98 = (pthread_mutex_t *)&this->lock;
  ::std::mutex::lock((mutex *)&local_98->__data);
  iVar10 = local_a8;
  this->insert_count = this->insert_count + iVar4;
  new_entry.batch_idx = local_a8;
  new_entry.total_rows = RowGroupCollection::GetTotalRows(this_00);
  new_entry.unflushed_memory = 0;
  if (iVar4 < uVar8) {
    new_entry.unflushed_memory = this_00->allocation_size;
    LOCK();
    paVar1 = &(this->memory_manager).unflushed_memory_usage;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + new_entry.unflushed_memory;
    UNLOCK();
    iVar10 = new_entry.batch_idx;
  }
  __position._M_current =
       (this->collections).
       super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
       super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->collections).
           super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
           super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pRVar2 - (long)__position._M_current;
  uVar8 = lVar5 / 0x28;
  uVar9 = lVar5 % 0x28;
  while (uVar6 = uVar8, 0 < (long)uVar6) {
    uVar8 = uVar6 >> 1;
    uVar9 = uVar8;
    if (__position._M_current[uVar8].batch_idx < iVar10) {
      uVar9 = ~uVar8 + uVar6;
      __position._M_current = __position._M_current + uVar8 + 1;
      uVar8 = uVar9;
    }
  }
  new_entry.collection_index = collection_index;
  new_entry.type = bVar11;
  if ((__position._M_current != pRVar2) && ((__position._M_current)->batch_idx == iVar10)) {
    pIVar7 = (InternalException *)__cxa_allocate_exception(0x10,__position._M_current,uVar9);
    ::std::__cxx11::string::string
              ((string *)&local_50,
               "PhysicalBatchInsert::AddCollection error: batch index %d is present in multiple collections. This occurs when batch indexes are not uniquely distributed over threads"
               ,&local_a9);
    InternalException::InternalException<unsigned_long>(pIVar7,&local_50,local_a8);
    __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>::insert
            (&(this->collections).
              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>,
             __position,&new_entry);
  if (writer_local.ptr != (OptimisticDataWriter *)0x0) {
    ScheduleMergeTasks(this,context,local_a0);
  }
  pthread_mutex_unlock(local_98);
  return;
}

Assistant:

void BatchInsertGlobalState::AddCollection(ClientContext &context, const idx_t batch_index, const idx_t min_batch_index,
                                           const PhysicalIndex collection_index,
                                           optional_ptr<OptimisticDataWriter> writer) {
	if (batch_index < min_batch_index) {
		throw InternalException("Batch index of the added collection (%llu) is smaller than the min batch index (%llu)",
		                        batch_index, min_batch_index);
	}
	auto &collection = table.GetStorage().GetOptimisticCollection(context, collection_index);
	auto new_count = collection.GetTotalRows();
	auto batch_type = new_count < row_group_size ? RowGroupBatchType::NOT_FLUSHED : RowGroupBatchType::FLUSHED;
	if (batch_type == RowGroupBatchType::FLUSHED && writer) {
		writer->WriteLastRowGroup(collection);
	}
	lock_guard<mutex> l(lock);
	insert_count += new_count;
	// add the collection to the batch index
	RowGroupBatchEntry new_entry(collection, batch_index, collection_index, batch_type);
	if (batch_type == RowGroupBatchType::NOT_FLUSHED) {
		memory_manager.IncreaseUnflushedMemory(new_entry.unflushed_memory);
	}

	auto it = std::lower_bound(
	    collections.begin(), collections.end(), new_entry,
	    [&](const RowGroupBatchEntry &a, const RowGroupBatchEntry &b) { return a.batch_idx < b.batch_idx; });
	if (it != collections.end() && it->batch_idx == new_entry.batch_idx) {
		throw InternalException("PhysicalBatchInsert::AddCollection error: batch index %d is present in multiple "
		                        "collections. This occurs when "
		                        "batch indexes are not uniquely distributed over threads",
		                        batch_index);
	}
	collections.insert(it, new_entry);
	if (writer) {
		ScheduleMergeTasks(context, min_batch_index);
	}
}